

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O3

void link_cb(uv_fs_t *req)

{
  int iVar1;
  undefined8 uVar2;
  undefined1 auStack_1c8 [88];
  long lStack_170;
  long lStack_168;
  
  if (req->fs_type == UV_FS_LINK) {
    if (req->result == 0) {
      link_cb_count = link_cb_count + 1;
      uv_fs_req_cleanup();
      return;
    }
  }
  else {
    link_cb_cold_1();
  }
  link_cb_cold_2();
  loop = (uv_loop_t *)uv_default_loop();
  iVar1 = uv_fs_readlink(loop,auStack_1c8,"no_such_file",dummy_cb);
  if (iVar1 == 0) {
    iVar1 = uv_run(loop,0);
    if (iVar1 != 0) goto LAB_0015ead0;
    if (dummy_cb_count != 1) goto LAB_0015ead5;
    if (lStack_168 != 0) goto LAB_0015eada;
    if (lStack_170 != -2) goto LAB_0015eadf;
    uv_fs_req_cleanup(auStack_1c8);
    iVar1 = uv_fs_readlink(0,auStack_1c8,"no_such_file",0);
    if (iVar1 != -2) goto LAB_0015eae4;
    if (lStack_168 != 0) goto LAB_0015eae9;
    if (lStack_170 == -2) {
      uv_fs_req_cleanup(auStack_1c8);
      uVar2 = uv_default_loop();
      uv_walk(uVar2,close_walk_cb,0);
      uv_run(uVar2,0);
      uVar2 = uv_default_loop();
      iVar1 = uv_loop_close(uVar2);
      if (iVar1 == 0) {
        uv_library_shutdown();
        return;
      }
      goto LAB_0015eaf3;
    }
  }
  else {
    run_test_fs_readlink_cold_1();
LAB_0015ead0:
    run_test_fs_readlink_cold_2();
LAB_0015ead5:
    run_test_fs_readlink_cold_3();
LAB_0015eada:
    run_test_fs_readlink_cold_4();
LAB_0015eadf:
    run_test_fs_readlink_cold_5();
LAB_0015eae4:
    run_test_fs_readlink_cold_6();
LAB_0015eae9:
    run_test_fs_readlink_cold_7();
  }
  run_test_fs_readlink_cold_8();
LAB_0015eaf3:
  run_test_fs_readlink_cold_9();
  dummy_cb_count = dummy_cb_count + 1;
  return;
}

Assistant:

static void link_cb(uv_fs_t* req) {
  ASSERT(req->fs_type == UV_FS_LINK);
  ASSERT(req->result == 0);
  link_cb_count++;
  uv_fs_req_cleanup(req);
}